

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::serializer(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,output_adapter_t<char> *s,char ichar,error_handler_t error_handler_)

{
  char cVar1;
  lconv *plVar2;
  char local_59;
  char local_49;
  allocator local_21;
  error_handler_t local_20;
  char local_19;
  error_handler_t error_handler__local;
  char ichar_local;
  output_adapter_t<char> *s_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  local_20 = error_handler_;
  local_19 = ichar;
  _error_handler__local = s;
  s_local = &this->o;
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>_>::shared_ptr(&this->o,s);
  memset(&this->number_buffer,0,0x40);
  plVar2 = localeconv();
  this->loc = (lconv *)plVar2;
  if (this->loc->thousands_sep == (char *)0x0) {
    local_49 = '\0';
  }
  else {
    local_49 = *this->loc->thousands_sep;
  }
  this->thousands_sep = local_49;
  if (this->loc->decimal_point == (char *)0x0) {
    local_59 = '\0';
  }
  else {
    local_59 = *this->loc->decimal_point;
  }
  this->decimal_point = local_59;
  memset(&this->string_buffer,0,0x200);
  this->indent_char = local_19;
  cVar1 = this->indent_char;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->indent_string,0x200,cVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  this->error_handler = local_20;
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar, error_handler_t error_handler_ = error_handler_t::strict)
		: o(std::move(s)),
		  loc(std::localeconv()),
		  thousands_sep(loc->thousands_sep == nullptr ? '\0' : *(loc->thousands_sep)),
		  decimal_point(loc->decimal_point == nullptr ? '\0' : *(loc->decimal_point)),
		  indent_char(ichar),
		  indent_string(512, indent_char),
		  error_handler(error_handler_) {}